

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_differencer.cc
# Opt level: O2

void google::protobuf::util::MatchIndicesPostProcessorForSmartList
               (vector<int,_std::allocator<int>_> *match_list1,
               vector<int,_std::allocator<int>_> *match_list2)

{
  reference pvVar1;
  int last_matched_index;
  value_type vVar2;
  size_t i;
  ulong __n;
  
  vVar2 = -1;
  __n = 0;
  do {
    if ((ulong)((long)(match_list1->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                      super__Vector_impl_data._M_finish -
                (long)(match_list1->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                      super__Vector_impl_data._M_start >> 2) <= __n) {
      return;
    }
    pvVar1 = std::vector<int,_std::allocator<int>_>::at(match_list1,__n);
    if (-1 < *pvVar1) {
      if (-1 < vVar2) {
        pvVar1 = std::vector<int,_std::allocator<int>_>::at(match_list1,__n);
        if (*pvVar1 <= vVar2) {
          pvVar1 = std::vector<int,_std::allocator<int>_>::at(match_list1,__n);
          pvVar1 = std::vector<int,_std::allocator<int>_>::at(match_list2,(long)*pvVar1);
          *pvVar1 = -1;
          pvVar1 = std::vector<int,_std::allocator<int>_>::at(match_list1,__n);
          *pvVar1 = -1;
          goto LAB_00cca8d8;
        }
      }
      pvVar1 = std::vector<int,_std::allocator<int>_>::at(match_list1,__n);
      vVar2 = *pvVar1;
    }
LAB_00cca8d8:
    __n = __n + 1;
  } while( true );
}

Assistant:

void MatchIndicesPostProcessorForSmartList(std::vector<int>* match_list1,
                                           std::vector<int>* match_list2) {
  int last_matched_index = -1;
  for (size_t i = 0; i < match_list1->size(); ++i) {
    if (match_list1->at(i) < 0) {
      continue;
    }
    if (last_matched_index < 0 || match_list1->at(i) > last_matched_index) {
      last_matched_index = match_list1->at(i);
    } else {
      match_list2->at(match_list1->at(i)) = -1;
      match_list1->at(i) = -1;
    }
  }
}